

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

StringRef llvm::yaml::ScalarTraits<llvm::yaml::Hex32,_void>::input
                    (StringRef Scalar,void *param_2,Hex32 *Val)

{
  bool bVar1;
  ulong in_RAX;
  char *pcVar2;
  size_t sVar3;
  unsigned_long_long *in_R8;
  StringRef Str;
  StringRef SVar4;
  ulong local_18;
  unsigned_long_long n;
  
  Str.Data = Scalar.Length;
  Str.Length = 0;
  local_18 = in_RAX;
  bVar1 = getAsUnsignedInteger((llvm *)Scalar.Data,Str,(uint)&local_18,in_R8);
  if (bVar1) {
    pcVar2 = "invalid hex32 number";
    sVar3 = 0x14;
  }
  else if (local_18 >> 0x20 == 0) {
    Val->value = (uint32_t)local_18;
    sVar3 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = "out of range hex32 number";
    sVar3 = 0x19;
  }
  SVar4.Length = sVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef ScalarTraits<Hex32>::input(StringRef Scalar, void *, Hex32 &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid hex32 number";
  if (n > 0xFFFFFFFFUL)
    return "out of range hex32 number";
  Val = n;
  return StringRef();
}